

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O2

bool google::protobuf::internal::anon_unknown_36::TreatEnumAsInt(FieldDescriptor *field)

{
  bool bVar1;
  EnumDescriptor *pEVar2;
  FieldDescriptor *pFVar3;
  bool bVar4;
  
  bVar1 = cpp::HasPreservingUnknownEnumSemantics(field);
  bVar4 = true;
  if (!bVar1) {
    pEVar2 = FieldDescriptor::enum_type(field);
    if ((pEVar2 == (EnumDescriptor *)0x0) || (field->containing_type_ == (Descriptor *)0x0)) {
      bVar4 = false;
    }
    else {
      pFVar3 = Descriptor::map_value(field->containing_type_);
      bVar4 = pFVar3 == field;
    }
  }
  return bVar4;
}

Assistant:

bool TreatEnumAsInt(const FieldDescriptor* field) {
  return cpp::HasPreservingUnknownEnumSemantics(field) ||
         // For legacy reasons, MapEntry mapped_type enum fields are handled as
         // open always. The validation happens elsewhere.
         (field->enum_type() != nullptr &&
          field->containing_type() != nullptr &&
          field->containing_type()->map_value() == field);
}